

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_shm_latency.cpp
# Opt level: O3

int main(void)

{
  __pid_t __pid;
  ostream *poVar1;
  long *plVar2;
  int return_status;
  int local_14;
  
  __pid = fork();
  if (__pid < 1) {
    if (__pid == 0) {
      child();
      exit(0);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Can\'t fork!",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
  }
  else {
    parent();
    waitpid(__pid,&local_14,0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Each shared memory size = ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Message length = ",0x11)
  ;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Number of roundtrips = ",0x17);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,1000000);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Parent process terminated",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {
    ::pid_t pid = ::fork();
    if (pid > 0) {
        parent();
        int return_status;
        ::waitpid(pid, &return_status, 0);
    } else if (pid == 0) {
        child();
        ::exit(0);
    } else {
        std::cout << "Can't fork!" << std::endl;
    }
    std::cout << "Each shared memory size = " << shm_size << std::endl;
    std::cout << "Message length = " << sizeof(Message) << std::endl;
    std::cout << "Number of roundtrips = " << times << std::endl;
    std::cout << "Parent process terminated" << std::endl;
    return 0;
}